

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

void __thiscall
MempoolAcceptResult::MempoolAcceptResult
          (MempoolAcceptResult *this,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_txns,int64_t vsize,CAmount fees,CFeeRate effective_feerate,
          vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          *wtxids_fee_calculations)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_result_type = VALID;
  ValidationState<TxValidationResult>::ValidationState
            (&(this->m_state).super_ValidationState<TxValidationResult>);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->m_replaced_transactions,(_List_node_header *)replaced_txns)
  ;
  (this->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = vsize;
  (this->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  (this->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = fees;
  (this->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  (this->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
       effective_feerate.nSatoshisPerK;
  (this->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  std::
  _Optional_payload_base<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>
  ::
  _Optional_payload_base<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>const&>
            ((_Optional_payload_base<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>
              *)&this->m_wtxids_fee_calculations,wtxids_fee_calculations);
  (this->m_other_wtxid).super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MempoolAcceptResult(std::list<CTransactionRef>&& replaced_txns,
                                 int64_t vsize,
                                 CAmount fees,
                                 CFeeRate effective_feerate,
                                 const std::vector<Wtxid>& wtxids_fee_calculations)
        : m_result_type(ResultType::VALID),
        m_replaced_transactions(std::move(replaced_txns)),
        m_vsize{vsize},
        m_base_fees(fees),
        m_effective_feerate(effective_feerate),
        m_wtxids_fee_calculations(wtxids_fee_calculations) {}